

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_write_to_gather(char *prefix,kvtree *data,int ranks)

{
  int iVar1;
  char *pcVar2;
  kvtree *pkVar3;
  kvtree *hash1;
  kvtree *files_rank_hash;
  unsigned_long offset;
  char partname [1024];
  char filename [1024];
  kvtree *rank_hash;
  kvtree *elem_hash;
  int rank;
  int count;
  kvtree *entries;
  kvtree_elem *elem;
  int max_rank;
  int writer;
  kvtree *files_hash;
  long entries_per_file;
  int rc;
  int ranks_local;
  kvtree *data_local;
  char *prefix_local;
  
  entries_per_file._0_4_ = 0;
  files_hash = (kvtree *)0x2000;
  entries_per_file._4_4_ = ranks;
  _rc = data;
  data_local = (kvtree *)prefix;
  pcVar2 = getenv("KVTREE_ENTRIES_PER_FILE");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = getenv("KVTREE_ENTRIES_PER_FILE");
    files_hash = (kvtree *)atol(pcVar2);
  }
  kvtree_sort_int(_rc,0);
  _max_rank = kvtree_new();
  kvtree_set_kv_int(_max_rank,"LEVEL",1);
  elem._4_4_ = 0;
  elem._0_4_ = -1;
  entries = (kvtree *)kvtree_elem_first(_rc);
  do {
    if (entries == (kvtree *)0x0) {
      kvtree_set_kv_int(_max_rank,"RANKS",entries_per_file._4_4_);
      iVar1 = kvtree_write_file((char *)data_local,_max_rank);
      if (iVar1 != 0) {
        entries_per_file._0_4_ = 1;
      }
      kvtree_delete((kvtree **)&max_rank);
      return (int)entries_per_file;
    }
    _rank = kvtree_new();
    kvtree_set_kv_int(_rank,"LEVEL",0);
    kvtree_set_kv_int(_rank,"RANKS",entries_per_file._4_4_);
    elem_hash._4_4_ = 0;
    do {
      if ((long)files_hash <= (long)elem_hash._4_4_) break;
      iVar1 = kvtree_elem_key_int((kvtree_elem *)entries);
      if ((int)elem < iVar1) {
        elem._0_4_ = iVar1;
      }
      pkVar3 = kvtree_elem_hash((kvtree_elem *)entries);
      hash1 = kvtree_set_kv_int(_rank,"RANK",iVar1);
      kvtree_merge(hash1,pkVar3);
      elem_hash._4_4_ = elem_hash._4_4_ + 1;
      entries = (kvtree *)kvtree_elem_next((kvtree_elem *)entries);
    } while ((kvtree_elem *)entries != (kvtree_elem *)0x0);
    snprintf(partname + 0x3f8,0x400,"%s.0.%d",data_local,(ulong)elem._4_4_);
    iVar1 = kvtree_write_file(partname + 0x3f8,_rank);
    if (iVar1 != 0) {
      entries_per_file._0_4_ = 1;
      entries = (kvtree *)0x0;
    }
    kvtree_delete((kvtree **)&rank);
    snprintf((char *)&offset,0x400,".0.%d",(ulong)elem._4_4_);
    pkVar3 = kvtree_set_kv_int(_max_rank,"RANK",elem._4_4_);
    kvtree_util_set_str(pkVar3,"FILE",(char *)&offset);
    kvtree_util_set_bytecount(pkVar3,"OFFSET",0);
    elem._4_4_ = elem_hash._4_4_ + elem._4_4_;
  } while( true );
}

Assistant:

int kvtree_write_to_gather(const char* prefix, kvtree* data, int ranks)
{
  int rc = KVTREE_SUCCESS;
  /* record up to 8K entries per file */
  long entries_per_file = 8192;

  /*
   * KVTREE_ENTRIES_PER_FILE is only used for testing.  Specifically, you can
   * set it to something low like 1 to force kvwrite_write_to_gather() to write
   * multiple kvtree files.
   */
  if (getenv("KVTREE_ENTRIES_PER_FILE")) {
    entries_per_file = atol(getenv("KVTREE_ENTRIES_PER_FILE"));
  }

  /* we hardcode this to be two levels deep */

  /* sort so that elements are ordered by rank value */
  kvtree_sort_int(data, KVTREE_SORT_ASCENDING);

  /* create hash for primary map and encode level */
  kvtree* files_hash = kvtree_new();
  kvtree_set_kv_int(files_hash, "LEVEL", 1);

  /* iterate over each rank to record its info */
  int writer = 0;
  int max_rank = -1;
  kvtree_elem* elem = kvtree_elem_first(data);
  while (elem != NULL) {
    /* create a hash to record an entry from each rank */
    kvtree* entries = kvtree_new();
    kvtree_set_kv_int(entries, "LEVEL", 0);

    /* record the total number of ranks in each file */
    kvtree_set_kv_int(entries, "RANKS", ranks);

    int count = 0;
    while (count < entries_per_file) {
      /* get rank id */
      int rank = kvtree_elem_key_int(elem);
      if (rank > max_rank) {
        max_rank = rank;
      }

      /* copy hash of current rank under RANK/<rank> in entries */
      kvtree* elem_hash = kvtree_elem_hash(elem);
      kvtree* rank_hash = kvtree_set_kv_int(entries, "RANK", rank);
      kvtree_merge(rank_hash, elem_hash);
      count++;

      /* break early if we reach the end */
      elem = kvtree_elem_next(elem);
      if (elem == NULL) {
        break;
      }
    }

    /* build name for part file */
    char filename[1024];
    snprintf(filename, sizeof(filename), "%s.0.%d", prefix, writer);

    /* write hash to file */
    if (kvtree_write_file(filename, entries) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
      elem = NULL;
    }

    /* delete part hash and path */
    kvtree_delete(&entries);

    /* record file name of part in files hash, relative to prefix directory */
    char partname[1024];
    snprintf(partname, sizeof(partname), ".0.%d", writer);
    unsigned long offset = 0;
    kvtree* files_rank_hash = kvtree_set_kv_int(files_hash, "RANK", writer);
    kvtree_util_set_str(files_rank_hash, "FILE", partname);
    kvtree_util_set_bytecount(files_rank_hash, "OFFSET", offset);

    /* get id of next writer */
    writer += count;
  }

  /* record total number of ranks in job as max rank + 1 */
  kvtree_set_kv_int(files_hash, "RANKS", ranks);

  /* write out root file */
  if (kvtree_write_file(prefix, files_hash) != KVTREE_SUCCESS) {
    rc = KVTREE_FAILURE;
  }
  kvtree_delete(&files_hash);

  return rc;
}